

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_getfenv(lua_State *L)

{
  ulong uVar1;
  lua_CFunction p_Var2;
  ulong local_a8;
  int32_t local_8c;
  cTValue *pcStack_88;
  int level;
  cTValue *o;
  GCfunc *fn;
  lua_State *L_local;
  
  pcStack_88 = L->base;
  fn = (GCfunc *)L;
  if ((L->top <= pcStack_88) || ((int)(pcStack_88->field_4).it >> 0xf != -9)) {
    local_8c = lj_lib_optint(L,1,1);
    pcStack_88 = lj_debug_frame((lua_State *)&fn->c,local_8c,&local_8c);
    if (pcStack_88 == (cTValue *)0x0) {
      lj_err_arg((lua_State *)&fn->c,1,LJ_ERR_INVLVL);
    }
    pcStack_88 = pcStack_88 + -1;
  }
  uVar1 = pcStack_88->u64;
  p_Var2 = (fn->c).f;
  (fn->c).f = p_Var2 + 8;
  if (*(char *)((uVar1 & 0x7fffffffffff) + 10) == '\0') {
    local_a8 = *(ulong *)((uVar1 & 0x7fffffffffff) + 0x10);
  }
  else {
    local_a8 = *(ulong *)((long)fn + 0x48);
  }
  *(ulong *)p_Var2 = local_a8 | 0xfffa000000000000;
  return 1;
}

Assistant:

LJLIB_CF(getfenv)		LJLIB_REC(.)
{
  GCfunc *fn;
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_optint(L, 1, 1);
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
    if (LJ_FR2) o--;
  }
  fn = &gcval(o)->fn;
  settabV(L, L->top++, isluafunc(fn) ? tabref(fn->l.env) : tabref(L->env));
  return 1;
}